

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O0

bool __thiscall Refal2::COperationsExecuter::matchRightBegin_V(COperationsExecuter *this)

{
  bool bVar1;
  CUnitNode **ppCVar2;
  COperationsExecuter *this_local;
  
  bVar1 = shiftRight(this);
  if (bVar1) {
    bVar1 = CUnit::IsRightParen(&this->right->super_CUnit);
    if (bVar1) {
      ppCVar2 = CUnit::PairedParen(&this->right->super_CUnit);
      this->right = *ppCVar2;
    }
    nextOperation(this);
    saveState(this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool COperationsExecuter::matchRightBegin_V()
{
	if( shiftRight() ) {
		if( right->IsRightParen() ) {
			right = right->PairedParen();
		}
		nextOperation();
		saveState();
		return true;
	} else {
		return false;
	}
}